

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O2

void GraphTask::add_edge_features(search *sch,task_data *D,size_t n,multi_ex *ec)

{
  pointer pvVar1;
  pointer puVar2;
  unsigned_long uVar3;
  example *peVar4;
  wclass *pwVar5;
  unsigned_long uVar6;
  vw *pvVar7;
  char cVar8;
  char cVar9;
  ulong uVar10;
  uint32_t *puVar11;
  pointer puVar12;
  long lVar13;
  size_t sVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  
  D->cur_node = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start[n];
  pvVar1 = (D->adj).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar12 = pvVar1[n].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            ((long)&pvVar1[n].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data + 8);
  do {
    if (puVar12 == puVar2) {
      v_array<unsigned_char>::push_back
                ((v_array<unsigned_char> *)
                 (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[n],&neighbor_namespace);
      peVar4 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[n];
      peVar4->total_sum_feat_sq =
           *(float *)((long)((peVar4->super_example_predict).feature_space + 0x83) + 0x60) +
           peVar4->total_sum_feat_sq;
      peVar4 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[n];
      peVar4->num_features =
           peVar4->num_features +
           ((long)*(float **)((long)((peVar4->super_example_predict).feature_space + 0x83) + 8) -
            (long)(peVar4->super_example_predict).feature_space[0x83].values._begin >> 2);
      Search::search::get_vw_pointer_unsafe(sch);
      return;
    }
    uVar3 = *puVar12;
    for (uVar10 = 0; uVar10 < D->numN; uVar10 = uVar10 + 1) {
      D->neighbor_predictions[uVar10] = 0.0;
    }
    if (D->use_structure == false) {
      *D->neighbor_predictions = *D->neighbor_predictions + 1.0;
      fVar20 = 0.0;
      fVar19 = 1.0;
LAB_00229b67:
      for (uVar10 = 0; uVar10 < D->numN; uVar10 = uVar10 + 1) {
        D->neighbor_predictions[uVar10] = D->neighbor_predictions[uVar10] / fVar19;
      }
      peVar4 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar3];
      if (fVar19 <= 1.0) {
        *D->neighbor_predictions = fVar20;
        pvVar7 = Search::search::get_vw_pointer_unsafe(sch);
        GD::
        foreach_feature<GraphTask::task_data,_unsigned_long,_&GraphTask::add_edge_features_single_fn>
                  (pvVar7,peVar4,D);
      }
      else {
        pvVar7 = Search::search::get_vw_pointer_unsafe(sch);
        GD::
        foreach_feature<GraphTask::task_data,_unsigned_long,_&GraphTask::add_edge_features_group_fn>
                  (pvVar7,peVar4,D);
      }
    }
    else {
      cVar8 = '\x01';
      if (D->directed == true) {
        peVar4 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar3];
        pwVar5 = (peVar4->l).cs.costs._begin;
        lVar13 = (long)(peVar4->l).cs.costs._end - (long)pwVar5 >> 4;
        puVar11 = &pwVar5->class_index;
        cVar8 = '\x01';
        while (lVar13 = lVar13 + -1, lVar13 != 0) {
          sVar14 = (ulong)*puVar11 - 1;
          cVar9 = '\0';
          if (sVar14 != n) {
            cVar9 = cVar8;
          }
          if ((*puVar11 == 0) || (puVar11 = puVar11 + 4, cVar8 = cVar9, sVar14 == n)) break;
        }
      }
      fVar19 = 0.0;
      uVar10 = 0;
      lVar13 = 4;
      cVar9 = '\0';
      uVar15 = 0;
      while( true ) {
        peVar4 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar3];
        pwVar5 = (peVar4->l).cs.costs._begin;
        uVar18 = (long)(peVar4->l).cs.costs._end - (long)pwVar5 >> 4;
        if (uVar18 <= uVar10) break;
        uVar17 = (ulong)*(uint *)((long)&pwVar5->x + lVar13);
        if (uVar17 == 0) {
          cVar9 = '\x01';
        }
        else {
          if (uVar10 == uVar18 - 1) {
            cVar9 = '\x01';
          }
          if (uVar17 - 1 != n) {
            if ((D->directed == true) && (cVar8 != cVar9)) {
              lVar16 = D->K + 1;
            }
            else {
              lVar16 = 0;
            }
            uVar6 = (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar17 - 1];
            D->neighbor_predictions[uVar6 + lVar16 + -1] =
                 D->neighbor_predictions[uVar6 + lVar16 + -1] + 1.0;
            fVar19 = fVar19 + 1.0;
            uVar15 = ((int)lVar16 +
                     (int)(D->pred).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar17 - 1]) - 1;
          }
        }
        uVar10 = uVar10 + 1;
        lVar13 = lVar13 + 0x10;
      }
      if ((fVar19 != 0.0) || (NAN(fVar19))) {
        fVar20 = (float)uVar15;
        goto LAB_00229b67;
      }
    }
    puVar12 = puVar12 + 1;
  } while( true );
}

Assistant:

void add_edge_features(Search::search& sch, task_data& D, size_t n, multi_ex& ec)
{
  D.cur_node = ec[n];

  for (size_t i : D.adj[n])
  {
    for (size_t k = 0; k < D.numN; k++) D.neighbor_predictions[k] = 0.;

    float pred_total = 0.;
    uint32_t last_pred = 0;
    if (D.use_structure)
    {
      bool n_in_sink = true;
      if (D.directed)
        for (size_t j = 0; j < ec[i]->l.cs.costs.size() - 1; j++)
        {
          size_t m = ec[i]->l.cs.costs[j].class_index;
          if (m == 0)
            break;
          if (m - 1 == n)
          {
            n_in_sink = false;
            break;
          }
        }

      bool m_in_sink = false;
      for (size_t j = 0; j < ec[i]->l.cs.costs.size(); j++)
      {
        size_t m = ec[i]->l.cs.costs[j].class_index;
        if (m == 0)
        {
          m_in_sink = true;
          continue;
        }
        if (j == ec[i]->l.cs.costs.size() - 1)
          m_in_sink = true;
        m--;
        if (m == n)
          continue;
        size_t other_side = (D.directed && (n_in_sink != m_in_sink)) ? (D.K + 1) : 0;
        D.neighbor_predictions[D.pred[m] - 1 + other_side] += 1.;
        pred_total += 1.;
        last_pred = (uint32_t)D.pred[m] - 1 + (uint32_t)other_side;
      }
    }
    else
    {
      D.neighbor_predictions[0] += 1.;
      pred_total += 1.;
      last_pred = 0;
    }

    if (pred_total == 0.)
      continue;
    // cerr << n << ':' << i << " -> ["; for (size_t k=0; k<D.numN; k++) cerr << ' ' << D.neighbor_predictions[k]; cerr
    // << " ]" << endl;
    for (size_t k = 0; k < D.numN; k++) D.neighbor_predictions[k] /= pred_total;
    example& edge = *ec[i];

    if (pred_total <= 1.)  // single edge
    {
      D.neighbor_predictions[0] = (float)last_pred;
      GD::foreach_feature<task_data, uint64_t, add_edge_features_single_fn>(sch.get_vw_pointer_unsafe(), edge, D);
    }
    else  // lots of edges
      GD::foreach_feature<task_data, uint64_t, add_edge_features_group_fn>(sch.get_vw_pointer_unsafe(), edge, D);
  }
  ec[n]->indices.push_back(neighbor_namespace);
  ec[n]->total_sum_feat_sq += ec[n]->feature_space[neighbor_namespace].sum_feat_sq;
  ec[n]->num_features += ec[n]->feature_space[neighbor_namespace].size();

  vw& all = sch.get_vw_pointer_unsafe();
  for (string& i : all.pairs)
  {
    int i0 = (int)i[0];
    int i1 = (int)i[1];
    if ((i0 == (int)neighbor_namespace) || (i1 == (int)neighbor_namespace))
    {
      ec[n]->num_features += ec[n]->feature_space[i0].size() * ec[n]->feature_space[i1].size();
      ec[n]->total_sum_feat_sq += ec[n]->feature_space[i0].sum_feat_sq * ec[n]->feature_space[i1].sum_feat_sq;
    }
  }
}